

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O0

string * __thiscall
license::hw_identifier::HwIdentifier::print_abi_cxx11_
          (string *__return_storage_ptr__,HwIdentifier *this)

{
  license *this_00;
  void *binaryData;
  int in_R8D;
  char local_4a [2];
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_38 [8];
  string result;
  HwIdentifier *this_local;
  
  result.field_2._8_8_ = this;
  this_00 = (license *)std::array<unsigned_char,_8UL>::data(&this->m_data);
  binaryData = (void *)std::array<unsigned_char,_8UL>::size(&this->m_data);
  base64_abi_cxx11_((string *)local_38,this_00,binaryData,5,in_R8D);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48 = (char *)std::__cxx11::string::end();
  local_4a[1] = 10;
  local_4a[0] = '-';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_40,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_48,local_4a + 1,local_4a);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string HwIdentifier::print() const {
	string result = base64(m_data.data(), m_data.size(), 5);
	std::replace(result.begin(), result.end(), '\n', '-');
	return result.substr(0, result.size() - 1);
}